

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* load(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *__return_storage_ptr__,string *fname)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  char cVar3;
  size_t sVar4;
  fstream f;
  char buf [4096];
  undefined1 auStack_1278 [8];
  _Alloc_node local_1270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  long local_1248 [4];
  byte abStack_1228 [496];
  char local_1038 [4104];
  
  std::fstream::fstream((string *)local_1248);
  std::fstream::open((string *)local_1248,(_Ios_Openmode)fname);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::fstream::close();
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
    ;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
    *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  else {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar2 = *(long *)(local_1248[0] + -0x18);
    if ((abStack_1228[lVar2] & 2) == 0) {
      do {
        std::ios::widen((char)auStack_1278 + (char)lVar2 + '0');
        std::istream::getline((char *)local_1248,(long)local_1038,'\0');
        local_1268._M_dataplus._M_p = (pointer)&local_1268.field_2;
        sVar4 = strlen(local_1038);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1268,local_1038,local_1038 + sVar4);
        local_1270._M_t = &__return_storage_ptr__->_M_t;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,(const_iterator)p_Var1,&local_1268,&local_1270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1268._M_dataplus._M_p != &local_1268.field_2) {
          operator_delete(local_1268._M_dataplus._M_p);
        }
        lVar2 = *(long *)(local_1248[0] + -0x18);
      } while ((abStack_1228[lVar2] & 2) == 0);
    }
  }
  std::fstream::~fstream(local_1248);
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> load(const std::string &fname) {
    std::fstream f;
    f.open(fname, std::ios::in);
    char buf[4096];
    if (f.is_open()) {
        std::set<std::string> set;
        while (!f.eof()) {
            f.getline(buf, sizeof(buf) / sizeof(char));
            set.insert({buf});
        }
        return set;
    }
    f.close();
    return std::set<std::string>();
}